

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

int __thiscall
leveldb::anon_unknown_0::ReverseKeyComparator::Compare(ReverseKeyComparator *this,Slice *a,Slice *b)

{
  int iVar1;
  Comparator *pCVar2;
  Slice *key;
  Slice *key_00;
  string local_80;
  pointer local_60;
  size_type sStack_58;
  string local_50;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  pCVar2 = BytewiseComparator();
  Reverse_abi_cxx11_(&local_50,(leveldb *)a,key);
  local_60 = local_50._M_dataplus._M_p;
  sStack_58 = local_50._M_string_length;
  Reverse_abi_cxx11_(&local_80,(leveldb *)b,key_00);
  local_30 = local_80._M_dataplus._M_p._0_4_;
  uStack_2c = local_80._M_dataplus._M_p._4_4_;
  uStack_28 = (undefined4)local_80._M_string_length;
  uStack_24 = local_80._M_string_length._4_4_;
  iVar1 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  return iVar1;
}

Assistant:

int Compare(const Slice& a, const Slice& b) const override {
    return BytewiseComparator()->Compare(Reverse(a), Reverse(b));
  }